

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

size_t __thiscall
httplib::detail::MultipartFormDataParser::buf_find(MultipartFormDataParser *this,string *s)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  size_t in_RSI;
  MultipartFormDataParser *in_RDI;
  size_t remaining_size;
  size_t pos;
  size_t off;
  value_type c;
  string *local_30;
  string *b;
  undefined7 in_stack_ffffffffffffffe0;
  char cVar5;
  MultipartFormDataParser *a;
  MultipartFormDataParser *in_stack_fffffffffffffff8;
  
  a = in_RDI;
  pcVar2 = (char *)std::__cxx11::string::front();
  cVar5 = *pcVar2;
  local_30 = (string *)in_RDI->buf_spos_;
  while( true ) {
    b = local_30;
    if ((string *)in_RDI->buf_epos_ <= local_30) {
      sVar3 = buf_size(in_RDI);
      return sVar3;
    }
    while( true ) {
      if (local_30 == (string *)in_RDI->buf_epos_) {
        sVar3 = buf_size(in_RDI);
        return sVar3;
      }
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&in_RDI->buf_);
      if (*pcVar2 == cVar5) break;
      local_30 = (string *)&local_30->field_0x1;
    }
    sVar3 = in_RDI->buf_epos_;
    uVar4 = std::__cxx11::string::size();
    if (sVar3 - (long)local_30 < uVar4) break;
    bVar1 = start_with(in_stack_fffffffffffffff8,&a->dash_,in_RSI,
                       CONCAT17(cVar5,in_stack_ffffffffffffffe0),b);
    if (bVar1) {
      return (long)local_30 - in_RDI->buf_spos_;
    }
    local_30 = (string *)&local_30->field_0x1;
  }
  sVar3 = buf_size(in_RDI);
  return sVar3;
}

Assistant:

size_t buf_find(const std::string &s) const {
    auto c = s.front();

    size_t off = buf_spos_;
    while (off < buf_epos_) {
      auto pos = off;
      while (true) {
        if (pos == buf_epos_) { return buf_size(); }
        if (buf_[pos] == c) { break; }
        pos++;
      }

      auto remaining_size = buf_epos_ - pos;
      if (s.size() > remaining_size) { return buf_size(); }

      if (start_with(buf_, pos, buf_epos_, s)) { return pos - buf_spos_; }

      off = pos + 1;
    }

    return buf_size();
  }